

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O3

pair<const_char_*const,_ValueType>
UniqueObjectHelper<std::pair<char_const*const,ValueType>>(int index)

{
  char *in_RAX;
  char *pcVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  ValueType VVar2;
  int in_ESI;
  undefined4 in_register_0000003c;
  char *pcVar3;
  pair<const_char_*const,_ValueType> pVar4;
  char *local_28;
  
  pcVar3 = (char *)CONCAT44(in_register_0000003c,index);
  local_28 = in_RAX;
  pcVar1 = UniqueObjectHelper<char*>(in_ESI);
  UniqueObjectHelper<ValueType>((int)&local_28);
  *(char **)pcVar3 = pcVar1;
  *(char **)(pcVar3 + 8) = "hi";
  ValueType::set_s((ValueType *)(pcVar3 + 8),local_28);
  VVar2.s_ = extraout_RDX;
  if (local_28 != "hi") {
    free(local_28);
    VVar2.s_ = extraout_RDX_00;
  }
  pVar4.second.s_ = VVar2.s_;
  pVar4.first = pcVar3;
  return pVar4;
}

Assistant:

pair<const char* const, ValueType> UniqueObjectHelper(int index) {
  return pair<const char* const, ValueType>(
      UniqueObjectHelper<char*>(index),
      UniqueObjectHelper<ValueType>(index + 1));
}